

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O1

void __thiscall
icu_63::CanonicalIterator::CanonicalIterator
          (CanonicalIterator *this,UnicodeString *sourceStr,UErrorCode *status)

{
  UBool UVar1;
  Normalizer2 *pNVar2;
  Normalizer2Impl *this_00;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__CanonicalIterator_003ad8c8;
  (this->source).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (this->source).fUnion.fStackFields.fLengthAndFlags = 2;
  this->pieces = (UnicodeString **)0x0;
  this->pieces_length = 0;
  this->pieces_lengths = (int32_t *)0x0;
  this->current = (int32_t *)0x0;
  this->current_length = 0;
  (this->buffer).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003b5258;
  (this->buffer).fUnion.fStackFields.fLengthAndFlags = 2;
  pNVar2 = Normalizer2::getNFDInstance(status);
  this->nfd = pNVar2;
  this_00 = Normalizer2Factory::getNFCImpl(status);
  this->nfcImpl = this_00;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    UVar1 = Normalizer2Impl::ensureCanonIterData(this_00,status);
    if (UVar1 != '\0') {
      setSource(this,sourceStr,status);
    }
  }
  return;
}

Assistant:

CanonicalIterator::CanonicalIterator(const UnicodeString &sourceStr, UErrorCode &status) :
    pieces(NULL),
    pieces_length(0),
    pieces_lengths(NULL),
    current(NULL),
    current_length(0),
    nfd(*Normalizer2::getNFDInstance(status)),
    nfcImpl(*Normalizer2Factory::getNFCImpl(status))
{
    if(U_SUCCESS(status) && nfcImpl.ensureCanonIterData(status)) {
      setSource(sourceStr, status);
    }
}